

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O1

const_buffer * __thiscall
cppcms::impl::cgi::fastcgi::format_output
          (const_buffer *__return_storage_ptr__,fastcgi *this,const_buffer *input,bool completed,
          error_code *param_3)

{
  ushort uVar1;
  pointer peVar2;
  size_t *psVar3;
  ulong uVar4;
  size_t sVar5;
  undefined7 in_register_00000009;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong s;
  entry *peVar9;
  size_t sVar10;
  bool bVar11;
  const_buffer *packet;
  const_buffer tmp_3;
  const_buffer tmp;
  buffer_impl<const_char_*> local_f8;
  undefined4 local_bc;
  buffer_impl<char_*> local_b8;
  ulong local_88;
  entry eStack_80;
  vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  local_70;
  size_t local_50;
  ulong local_48;
  fcgi_header *local_40;
  fcgi_header *local_38;
  
  local_88 = local_88 & 0xffffffff00000000;
  local_70.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (entry *)0x0;
  local_70.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->response_headers_written_ == false) {
    local_b8.size_ = 0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<const_char_*>::add
              ((buffer_impl<const_char_*> *)&local_b8,(this->response_headers_)._M_dataplus._M_p,
               (this->response_headers_)._M_string_length);
    local_f8.entry_.size = local_b8.entry_.size;
    local_f8._0_8_ = CONCAT44(local_b8._4_4_,local_b8.size_);
    local_f8.entry_.ptr = local_b8.entry_.ptr;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::vector(&local_f8.vec_,
             (vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              *)&local_b8.vec_);
    booster::aio::details::add<booster::aio::const_buffer>((const_buffer *)&local_f8,input);
    peVar2 = local_70.
             super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    eStack_80.size = local_f8.entry_.size;
    local_88 = local_f8._0_8_;
    eStack_80.ptr = local_f8.entry_.ptr;
    local_70.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_f8.vec_.
         super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_70.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_f8.vec_.
         super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_70.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_f8.vec_.
         super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (entry *)0x0;
    local_f8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.vec_.
    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (peVar2 != (entry *)0x0) {
      operator_delete(peVar2);
    }
    if (local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
      operator_delete(local_f8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    this->response_headers_written_ = true;
  }
  else {
    eStack_80.size = (input->super_buffer_impl<const_char_*>).entry_.size;
    local_88 = *(ulong *)&input->super_buffer_impl<const_char_*>;
    eStack_80.ptr = (input->super_buffer_impl<const_char_*>).entry_.ptr;
    std::
    vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::operator=(&local_70,&(input->super_buffer_impl<const_char_*>).vec_);
  }
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = 0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = local_88 & 0xffffffff;
  if (uVar4 == 0) {
    peVar9 = (entry *)0x0;
  }
  else {
    peVar9 = local_70.
             super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)local_88 == 1) {
      peVar9 = &eStack_80;
    }
  }
  local_bc = (undefined4)CONCAT71(in_register_00000009,completed);
  if ((uVar4 != 0) && (uVar4 = eStack_80.size, (int)local_88 != 1)) {
    if ((long)local_70.
              super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.
              super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      uVar4 = 0;
    }
    else {
      lVar6 = (long)local_70.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_70.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      lVar6 = lVar6 + (ulong)(lVar6 == 0);
      psVar3 = &(local_70.
                 super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 ._M_impl.super__Vector_impl_data._M_start)->size;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + *psVar3;
        psVar3 = psVar3 + 2;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  local_50 = uVar4;
  if (uVar4 != 0) {
    local_38 = &this->header_;
    local_40 = &this->full_header_;
    sVar10 = 0;
    do {
      if (uVar4 < 0x10000) {
        (this->header_).version = '\0';
        (this->header_).type = '\0';
        (this->header_).request_id = 0;
        (this->header_).content_length = 0;
        (this->header_).padding_length = '\0';
        (this->header_).reserved = '\0';
        (this->header_).version = '\x01';
        (this->header_).type = '\x06';
        uVar1 = (ushort)this->request_id_;
        uVar7 = -(int)uVar4 & 7;
        (this->header_).padding_length = (uchar)uVar7;
        (this->header_).request_id = uVar1 << 8 | uVar1 >> 8;
        (this->header_).content_length = (ushort)uVar4 << 8 | (ushort)uVar4 >> 8;
        local_b8.size_ = 0;
        local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        booster::aio::buffer_impl<char_*>::add(&local_b8,(char *)local_38,8);
        booster::aio::const_buffer::const_buffer
                  ((const_buffer *)&local_f8,(mutable_buffer *)&local_b8);
        booster::aio::details::add<booster::aio::const_buffer>
                  (__return_storage_ptr__,(const_buffer *)&local_f8);
        if (local_f8.vec_.
            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
            ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
          operator_delete(local_f8.vec_.
                          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.vec_.
            super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.vec_.
                          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        local_48 = (ulong)uVar7;
        uVar8 = uVar4;
      }
      else {
        if (uVar4 == local_50) {
          (this->full_header_).version = '\x01';
          (this->full_header_).type = '\x06';
          uVar1 = (ushort)this->request_id_;
          (this->full_header_).content_length = 0xffff;
          (this->full_header_).padding_length = '\x01';
          (this->full_header_).request_id = uVar1 << 8 | uVar1 >> 8;
        }
        local_b8.size_ = 0;
        local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        booster::aio::buffer_impl<char_*>::add(&local_b8,(char *)local_40,8);
        booster::aio::const_buffer::const_buffer
                  ((const_buffer *)&local_f8,(mutable_buffer *)&local_b8);
        booster::aio::details::add<booster::aio::const_buffer>
                  (__return_storage_ptr__,(const_buffer *)&local_f8);
        if (local_f8.vec_.
            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
            ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
          operator_delete(local_f8.vec_.
                          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.vec_.
            super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.vec_.
                          super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        local_48 = 1;
        uVar8 = 0xffff;
      }
      uVar4 = uVar4 - uVar8;
      do {
        s = peVar9->size - sVar10;
        if (uVar8 <= s) {
          s = uVar8;
        }
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
        local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        booster::aio::buffer_impl<const_char_*>::add(&local_f8,peVar9->ptr + sVar10,s);
        booster::aio::details::add<booster::aio::const_buffer>
                  (__return_storage_ptr__,(const_buffer *)&local_f8);
        if (local_f8.vec_.
            super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f8.vec_.
                          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        sVar5 = sVar10 + s;
        bVar11 = sVar5 == peVar9->size;
        sVar10 = 0;
        if (!bVar11) {
          sVar10 = sVar5;
        }
        peVar9 = peVar9 + bVar11;
        uVar8 = uVar8 - s;
      } while (uVar8 != 0);
      local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
      local_f8.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (entry *)0x0;
      local_f8.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      booster::aio::buffer_impl<const_char_*>::add(&local_f8,"",local_48);
      booster::aio::details::add<booster::aio::const_buffer>
                (__return_storage_ptr__,(const_buffer *)&local_f8);
      if (local_f8.vec_.
          super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
          ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
        operator_delete(local_f8.vec_.
                        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (uVar4 != 0);
  }
  if ((char)local_bc != '\0') {
    prepare_eof(this);
    local_b8.size_ = 0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<char_*>::add(&local_b8,(char *)&this->eof_,0x18);
    booster::aio::const_buffer::const_buffer((const_buffer *)&local_f8,(mutable_buffer *)&local_b8);
    booster::aio::details::add<booster::aio::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_f8);
    if (local_f8.vec_.
        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
      operator_delete(local_f8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_70.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (entry *)0x0) {
    operator_delete(local_70.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual booster::aio::const_buffer format_output(booster::aio::const_buffer const &input,bool completed,booster::system::error_code &)
		{
			booster::aio::const_buffer in;
			if(!response_headers_written_) {
				in=booster::aio::buffer(response_headers_) + input;
				response_headers_written_ = true;
			}
			else {
				in = input;
			}
			booster::aio::const_buffer packet;
			booster::aio::const_buffer::entry const *chunks = in.get().first;
//#define DEBUG_FASTCGI
#ifdef DEBUG_FASTCGI
			{
				size_t n=in.get().second;
				printf("Format output of %d:\n",int(in.bytes_count()));
				for(size_t i=0;i<n;i++) {
					printf("[%.*s]",int(chunks[i].size),chunks[i].ptr);
				}
				if(completed) {
					printf("\nEOF\n");
				}
				else {
					printf("\n---\n");
				}
			}
#endif
			size_t reminder = in.bytes_count();
			size_t in_size = reminder;
			size_t chunk_consumed = 0;
			while(reminder > 0) {
				static const char pad[8]={0,0,0,0,0,0,0,0};
				static const size_t max_packet_len = 65535;
				size_t chunk = 0;
				int pad_len = 0;
				if(reminder > max_packet_len) {
					chunk = max_packet_len;
					if(in_size > max_packet_len && reminder == in_size) {
						// prepare only once
						full_header_.version = fcgi_version_1;
						full_header_.type=fcgi_stdout;
						full_header_.request_id=request_id_;
						full_header_.content_length = max_packet_len;
						full_header_.padding_length = pad_len = 1;
						full_header_.to_net();
					}
					else {
						pad_len = 1;
					}
					packet += io::buffer(&full_header_,sizeof(full_header_));
				}
				else {
					chunk = reminder;
					memset(&header_,0,sizeof(header_));
					header_.version=fcgi_version_1;
					header_.type=fcgi_stdout;
					header_.request_id=request_id_;
					header_.content_length = reminder;
					header_.padding_length =pad_len = (8 - (reminder % 8)) % 8;
					header_.to_net();

					packet += io::buffer(&header_,sizeof(header_));
				}

				reminder -= chunk;
				while(chunk > 0) {
					size_t next_size = chunks->size - chunk_consumed;
					if(next_size > chunk)
						next_size = chunk;

					packet += io::buffer(chunks->ptr + chunk_consumed, next_size);
					chunk_consumed += next_size;
					chunk -= next_size;
					if(chunk_consumed == chunks->size) {
						chunks++;
						chunk_consumed = 0;
					}
				}

				packet += io::buffer(pad,pad_len);
			}
			if(completed) {
				prepare_eof();
				packet += io::buffer(&eof_,sizeof(eof_));
			}
			#ifdef DEBUG_FASTCGI
			std::pair<booster::aio::const_buffer::entry const *,size_t> cnk = packet.get();
			for(size_t i=0;i<cnk.second;i++) {
				std::cerr << "[ " << (void const *)(cnk.first[i].ptr) << " " << cnk.first[i].size << "]\n" << std::endl;
			}
			#endif
			return packet;
		}